

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall wabt::interp::Memory::Memory(Memory *this,Store *param_1,MemoryType *type)

{
  uint64_t uVar1;
  bool bVar2;
  bool bVar3;
  undefined5 uVar4;
  
  (this->super_Extern).super_Object.kind_ = Memory;
  *(undefined8 *)&(this->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Extern).super_Object.finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Extern).super_Object.host_info_ = (void *)0x0;
  (this->super_Extern).super_Object.self_.index = 0;
  (this->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Memory_001d5138;
  (this->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001d1580;
  (this->type_).super_ExternType.kind = (type->super_ExternType).kind;
  (this->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001d52e0;
  uVar1 = (type->limits).max;
  (this->type_).limits.initial = (type->limits).initial;
  (this->type_).limits.max = uVar1;
  bVar2 = (type->limits).is_shared;
  bVar3 = (type->limits).is_64;
  uVar4 = *(undefined5 *)&(type->limits).field_0x13;
  (this->type_).limits.has_max = (type->limits).has_max;
  (this->type_).limits.is_shared = bVar2;
  (this->type_).limits.is_64 = bVar3;
  *(undefined5 *)&(this->type_).limits.field_0x13 = uVar4;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (type->limits).initial;
  this->pages_ = uVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,uVar1 << 0x10);
  return;
}

Assistant:

inline Object::Object(ObjectKind kind) : kind_(kind) {}